

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module_instrumentation.cpp
# Opt level: O0

Id dxil_spv::build_hash_call(SPIRVModule *module)

{
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  Block *pBVar1;
  Id IVar2;
  Function *this;
  Instruction *pIVar3;
  Instruction *this_00;
  Instruction *this_01;
  Instruction *extract;
  Instruction *mult;
  Instruction *xor_op;
  Instruction *shifted;
  Instruction *shuffle;
  int i;
  Id local_f4;
  iterator local_f0;
  undefined8 local_e8;
  vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> local_e0;
  Id local_c8;
  Id local_c4;
  Id const8_splat;
  Id const8;
  Id splat_id;
  Id ret_id;
  Instruction *splat;
  Instruction *construct;
  Instruction *mask_hi;
  Instruction *shift_lo;
  Instruction *extract1;
  Instruction *extract0;
  allocator_type local_69;
  Id local_68;
  Id local_64;
  iterator local_60;
  undefined8 local_58;
  vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> local_50;
  Function *local_38;
  Function *func;
  Id uvec2_type;
  Id uint_type;
  Block *entry;
  Block *current_build_point;
  Builder *builder;
  SPIRVModule *module_local;
  
  builder = (Builder *)module;
  current_build_point = (Block *)SPIRVModule::get_builder(module);
  entry = spv::Builder::getBuildPoint((Builder *)current_build_point);
  _uvec2_type = (Block *)0x0;
  func._4_4_ = spv::Builder::makeUintType((Builder *)current_build_point,0x20);
  local_68 = spv::Builder::makeVectorType((Builder *)current_build_point,func._4_4_,2);
  pBVar1 = current_build_point;
  IVar2 = func._4_4_;
  local_64 = func._4_4_;
  local_60 = &local_68;
  local_58 = 2;
  __l_00._M_len = 2;
  __l_00._M_array = local_60;
  func._0_4_ = local_68;
  std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector
            (&local_50,__l_00,&local_69);
  memset(&extract0,0,0x18);
  std::
  vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ::vector((vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
            *)&extract0);
  this = spv::Builder::makeFunctionEntry
                   ((Builder *)pBVar1,DecorationMax,IVar2,"AddrHash",&local_50,
                    (Vector<dxil_spv::Vector<Decoration>_> *)&extract0,(Block **)&uvec2_type);
  std::
  vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ::~vector((vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
             *)&extract0);
  std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~vector(&local_50);
  pBVar1 = current_build_point;
  local_38 = this;
  IVar2 = spv::Function::getParamId(this,0);
  spv::Builder::addName((Builder *)pBVar1,IVar2,"addr");
  pBVar1 = current_build_point;
  IVar2 = spv::Function::getParamId(local_38,1);
  spv::Builder::addName((Builder *)pBVar1,IVar2,"prime");
  extract1 = spv::Builder::addInstruction
                       ((Builder *)current_build_point,func._4_4_,OpCompositeExtract);
  shift_lo = spv::Builder::addInstruction
                       ((Builder *)current_build_point,func._4_4_,OpCompositeExtract);
  mask_hi = spv::Builder::addInstruction
                      ((Builder *)current_build_point,func._4_4_,OpShiftRightLogical);
  construct = spv::Builder::addInstruction((Builder *)current_build_point,func._4_4_,OpBitwiseAnd);
  splat = spv::Builder::addInstruction((Builder *)current_build_point,(Id)func,OpCompositeConstruct)
  ;
  _splat_id = spv::Builder::addInstruction
                        ((Builder *)current_build_point,(Id)func,OpCompositeConstruct);
  pIVar3 = extract1;
  IVar2 = spv::Function::getParamId(local_38,0);
  spv::Instruction::addIdOperand(pIVar3,IVar2);
  spv::Instruction::addImmediateOperand(extract1,0);
  pIVar3 = shift_lo;
  IVar2 = spv::Function::getParamId(local_38,0);
  spv::Instruction::addIdOperand(pIVar3,IVar2);
  spv::Instruction::addImmediateOperand(shift_lo,1);
  pIVar3 = mask_hi;
  IVar2 = spv::Instruction::getResultId(extract1);
  spv::Instruction::addIdOperand(pIVar3,IVar2);
  pIVar3 = mask_hi;
  IVar2 = spv::Builder::makeUintConstant((Builder *)current_build_point,4,false);
  spv::Instruction::addIdOperand(pIVar3,IVar2);
  pIVar3 = construct;
  IVar2 = spv::Instruction::getResultId(shift_lo);
  spv::Instruction::addIdOperand(pIVar3,IVar2);
  pIVar3 = construct;
  IVar2 = spv::Builder::makeUintConstant((Builder *)current_build_point,0xffff,false);
  spv::Instruction::addIdOperand(pIVar3,IVar2);
  pIVar3 = splat;
  IVar2 = spv::Instruction::getResultId(mask_hi);
  spv::Instruction::addIdOperand(pIVar3,IVar2);
  pIVar3 = splat;
  IVar2 = spv::Instruction::getResultId(construct);
  spv::Instruction::addIdOperand(pIVar3,IVar2);
  pIVar3 = _splat_id;
  IVar2 = spv::Function::getParamId(local_38,1);
  spv::Instruction::addIdOperand(pIVar3,IVar2);
  pIVar3 = _splat_id;
  IVar2 = spv::Function::getParamId(local_38,1);
  spv::Instruction::addIdOperand(pIVar3,IVar2);
  const8 = spv::Instruction::getResultId(splat);
  const8_splat = spv::Instruction::getResultId(_splat_id);
  i = spv::Builder::makeUintConstant((Builder *)current_build_point,8,false);
  pBVar1 = current_build_point;
  IVar2 = (Id)func;
  local_f0 = (iterator)&i;
  local_e8 = 2;
  __l._M_len = 2;
  __l._M_array = local_f0;
  local_f4 = i;
  local_c4 = i;
  std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector
            (&local_e0,__l,(allocator_type *)((long)&shuffle + 7));
  IVar2 = spv::Builder::makeCompositeConstant((Builder *)pBVar1,IVar2,&local_e0,false);
  std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~vector(&local_e0);
  local_c8 = IVar2;
  for (shuffle._0_4_ = 0; (int)shuffle < 6; shuffle._0_4_ = (int)shuffle + 1) {
    pIVar3 = spv::Builder::addInstruction((Builder *)current_build_point,(Id)func,OpVectorShuffle);
    spv::Instruction::addIdOperand(pIVar3,const8);
    spv::Instruction::addIdOperand(pIVar3,const8);
    spv::Instruction::addImmediateOperand(pIVar3,1);
    spv::Instruction::addImmediateOperand(pIVar3,0);
    this_00 = spv::Builder::addInstruction
                        ((Builder *)current_build_point,(Id)func,OpShiftRightLogical);
    spv::Instruction::addIdOperand(this_00,const8);
    spv::Instruction::addIdOperand(this_00,local_c8);
    this_01 = spv::Builder::addInstruction((Builder *)current_build_point,(Id)func,OpBitwiseXor);
    IVar2 = spv::Instruction::getResultId(this_00);
    spv::Instruction::addIdOperand(this_01,IVar2);
    IVar2 = spv::Instruction::getResultId(pIVar3);
    spv::Instruction::addIdOperand(this_01,IVar2);
    pIVar3 = spv::Builder::addInstruction((Builder *)current_build_point,(Id)func,OpIMul);
    IVar2 = spv::Instruction::getResultId(this_01);
    spv::Instruction::addIdOperand(pIVar3,IVar2);
    spv::Instruction::addIdOperand(pIVar3,const8_splat);
    const8 = spv::Instruction::getResultId(pIVar3);
  }
  pIVar3 = spv::Builder::addInstruction
                     ((Builder *)current_build_point,func._4_4_,OpCompositeExtract);
  spv::Instruction::addIdOperand(pIVar3,const8);
  spv::Instruction::addImmediateOperand(pIVar3,0);
  const8 = spv::Instruction::getResultId(pIVar3);
  spv::Builder::makeReturn((Builder *)current_build_point,false,const8);
  spv::Builder::setBuildPoint((Builder *)current_build_point,entry);
  IVar2 = spv::Function::getId(local_38);
  return IVar2;
}

Assistant:

static spv::Id build_hash_call(SPIRVModule &module)
{
	auto &builder = module.get_builder();

	auto *current_build_point = builder.getBuildPoint();
	spv::Block *entry = nullptr;
	spv::Id uint_type = builder.makeUintType(32);
	spv::Id uvec2_type = builder.makeVectorType(uint_type, 2);

	auto *func =
	    builder.makeFunctionEntry(spv::NoPrecision, uint_type, "AddrHash", { uvec2_type, uint_type }, {}, &entry);

	builder.addName(func->getParamId(0), "addr");
	builder.addName(func->getParamId(1), "prime");

	auto *extract0 = builder.addInstruction(uint_type, spv::OpCompositeExtract);
	auto *extract1 = builder.addInstruction(uint_type, spv::OpCompositeExtract);
	auto *shift_lo = builder.addInstruction(uint_type, spv::OpShiftRightLogical);
	auto *mask_hi = builder.addInstruction(uint_type, spv::OpBitwiseAnd);
	auto *construct = builder.addInstruction(uvec2_type, spv::OpCompositeConstruct);
	auto *splat = builder.addInstruction(uvec2_type, spv::OpCompositeConstruct);

	extract0->addIdOperand(func->getParamId(0));
	extract0->addImmediateOperand(0);
	extract1->addIdOperand(func->getParamId(0));
	extract1->addImmediateOperand(1);

	shift_lo->addIdOperand(extract0->getResultId());
	shift_lo->addIdOperand(builder.makeUintConstant(4));
	mask_hi->addIdOperand(extract1->getResultId());
	mask_hi->addIdOperand(builder.makeUintConstant(0xffff));

	construct->addIdOperand(shift_lo->getResultId());
	construct->addIdOperand(mask_hi->getResultId());

	splat->addIdOperand(func->getParamId(1));
	splat->addIdOperand(func->getParamId(1));

	spv::Id ret_id = construct->getResultId();
	spv::Id splat_id = splat->getResultId();

	spv::Id const8 = builder.makeUintConstant(8);
	spv::Id const8_splat = builder.makeCompositeConstant(uvec2_type, { const8, const8 });

	for (int i = 0; i < 6; i++)
	{
		auto *shuffle = builder.addInstruction(uvec2_type, spv::OpVectorShuffle);
		shuffle->addIdOperand(ret_id);
		shuffle->addIdOperand(ret_id);
		shuffle->addImmediateOperand(1);
		shuffle->addImmediateOperand(0);

		auto *shifted = builder.addInstruction(uvec2_type, spv::OpShiftRightLogical);
		shifted->addIdOperand(ret_id);
		shifted->addIdOperand(const8_splat);

		auto *xor_op = builder.addInstruction(uvec2_type, spv::OpBitwiseXor);
		xor_op->addIdOperand(shifted->getResultId());
		xor_op->addIdOperand(shuffle->getResultId());

		auto *mult = builder.addInstruction(uvec2_type, spv::OpIMul);
		mult->addIdOperand(xor_op->getResultId());
		mult->addIdOperand(splat_id);

		ret_id = mult->getResultId();
	}

	auto *extract = builder.addInstruction(uint_type, spv::OpCompositeExtract);
	extract->addIdOperand(ret_id);
	extract->addImmediateOperand(0);
	ret_id = extract->getResultId();

	builder.makeReturn(false, ret_id);
	builder.setBuildPoint(current_build_point);
	return func->getId();
}